

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O0

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  bool bVar1;
  Enum EVar2;
  Enum EVar3;
  Address AVar4;
  ulong uVar5;
  Type local_98;
  mapped_type *local_90;
  mapped_type *access;
  mapped_type *var;
  undefined1 local_78 [8];
  string name;
  Address byte_size;
  Node *addr_exp_local;
  Address align_local;
  uint64_t offset_local;
  LoadStoreTracking *this_local;
  Type type_local;
  Opcode opc_local;
  
  align_local = offset;
  offset_local = (uint64_t)this;
  unique0x100002a8 = type;
  type_local.enum_ = opc.enum_;
  AVar4 = Opcode::GetMemorySize((Opcode *)&type_local);
  name.field_2._12_4_ = type_local.enum_;
  register0x00000000 = GetMemoryType(stack0xffffffffffffffec,(Opcode)type_local.enum_);
  AddrExpName_abi_cxx11_((string *)local_78,this,addr_exp);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    var._4_4_ = 1;
    goto LAB_0020e48d;
  }
  access = (mapped_type *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
           ::operator[](&this->vars,(key_type *)local_78);
  local_90 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[]((map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
                           *)access,&align_local);
  if (local_90->byte_size != 0) {
    if (local_90->byte_size == AVar4) {
      EVar2 = Type::operator_cast_to_Enum(&local_90->type);
      EVar3 = Type::operator_cast_to_Enum((Type *)((long)&this_local + 4));
      if ((EVar2 == EVar3) && (local_90->align == align)) goto LAB_0020e39b;
    }
    local_90->is_uniform = false;
  }
LAB_0020e39b:
  bVar1 = Opcode::IsNaturallyAligned((Opcode *)&type_local,align);
  if (!bVar1) {
    local_90->is_uniform = false;
  }
  local_90->byte_size = AVar4;
  local_90->type = stack0xffffffffffffffec;
  local_90->align = align;
  EVar2 = Type::operator_cast_to_Enum((Type *)((long)&access[1].align + 4));
  EVar3 = Type::operator_cast_to_Enum((Type *)((long)&this_local + 4));
  if (EVar2 == EVar3) {
LAB_0020e41d:
    if ((access[2].byte_size != align) && (access[2].byte_size != 0xffffffffffffffff))
    goto LAB_0020e45a;
    *(Type *)((long)&access[1].align + 4) = stack0xffffffffffffffec;
    access[2].byte_size = align;
    access[2].type.enum_ = type_local.enum_;
  }
  else {
    EVar2 = Type::operator_cast_to_Enum((Type *)((long)&access[1].align + 4));
    if (EVar2 == Any) goto LAB_0020e41d;
LAB_0020e45a:
    Type::Type(&local_98,Void);
    *(Type *)((long)&access[1].align + 4) = local_98;
    access[2].byte_size = 0xffffffffffffffff;
  }
  var._4_4_ = 0;
LAB_0020e48d:
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void LoadStore(uint64_t offset,
                 Opcode opc,
                 Type type,
                 Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size && ((access.byte_size != byte_size) ||
                             (access.type != type) || (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }